

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall Chainstate::LoadChainTip(Chainstate *this)

{
  long lVar1;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  int source_line;
  CCoinsViewCache *pCVar3;
  CBlockIndex *pCVar4;
  ConstevalFormatString<4U> fmt;
  CBlockIndex *in_RDI;
  long in_FS_OFFSET;
  char *pcVar5;
  CBlockIndex *pindex;
  CBlockIndex *tip;
  CCoinsViewCache *coins_cache;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar6;
  int in_stack_fffffffffffffe1c;
  base_blob<256U> *in_stack_fffffffffffffe20;
  CBlockIndex *in_stack_fffffffffffffe28;
  CBlockIndex *in_stack_fffffffffffffe30;
  BlockManager *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  uint32_t *flag;
  bool local_161;
  ChainTxData *in_stack_fffffffffffffea8;
  CBlockIndex *pCVar7;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  int64_t in_stack_fffffffffffffef8;
  undefined1 local_88 [32];
  undefined1 local_68 [40];
  Level in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  double *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe1c,(AnnotatedMixin<std::recursive_mutex> *)0x7e63e3);
  pCVar3 = CoinsTip((Chainstate *)in_stack_fffffffffffffe38);
  (*(pCVar3->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&stack0xffffffffffffffd8)
  ;
  bVar2 = base_blob<256U>::IsNull((base_blob<256U> *)in_stack_fffffffffffffe28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!coins_cache.GetBestBlock().IsNull()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x122c,"bool Chainstate::LoadChainTip()");
  }
  pCVar4 = CChain::Tip((CChain *)in_stack_fffffffffffffe28);
  local_161 = false;
  if (pCVar4 != (CBlockIndex *)0x0) {
    CBlockIndex::GetBlockHash(in_stack_fffffffffffffe28);
    (*(pCVar3->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(local_68);
    local_161 = ::operator==((base_blob<256U> *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20)
    ;
  }
  if (local_161 == false) {
    (*(pCVar3->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(local_88);
    pCVar4 = ::node::BlockManager::LookupBlockIndex
                       (in_stack_fffffffffffffe38,(uint256 *)in_stack_fffffffffffffe30);
    if (pCVar4 == (CBlockIndex *)0x0) {
      bVar2 = false;
    }
    else {
      flag = &in_RDI->nStatus;
      CChain::SetTip((CChain *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      PruneBlockIndexCandidates
                ((Chainstate *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      fmt.fmt = (char *)CChain::Tip((CChain *)in_stack_fffffffffffffe28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                 (char *)in_stack_fffffffffffffe30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe38,
                 (char *)in_stack_fffffffffffffe30);
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffe28);
      base_blob<256u>::ToString_abi_cxx11_(in_stack_fffffffffffffe20);
      source_line = CChain::Height((CChain *)
                                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      CBlockIndex::GetBlockTime
                ((CBlockIndex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      FormatISO8601DateTime_abi_cxx11_(in_stack_fffffffffffffef8);
      ChainstateManager::GetParams
                ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
      ;
      CChainParams::TxData
                ((CChainParams *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      pcVar5 = (char *)GuessVerificationProgress(in_stack_fffffffffffffea8,in_RDI);
      uVar6 = 2;
      logging_function._M_len._7_1_ = in_stack_fffffffffffffee7;
      logging_function._M_len._0_7_ = in_stack_fffffffffffffee0;
      logging_function._M_str = pcVar5;
      source_file._M_str = (char *)pCVar7;
      source_file._M_len = (size_t)pCVar3;
      LogPrintFormatInternal<std::__cxx11::string,int,std::__cxx11::string,double>
                (logging_function,source_file,source_line,(LogFlags)flag,in_stack_ffffffffffffffc0,
                 fmt,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,
                 in_stack_ffffffffffffffe8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,uVar6));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe1c,uVar6));
      bVar2 = true;
    }
  }
  else {
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::LoadChainTip()
{
    AssertLockHeld(cs_main);
    const CCoinsViewCache& coins_cache = CoinsTip();
    assert(!coins_cache.GetBestBlock().IsNull()); // Never called when the coins view is empty
    const CBlockIndex* tip = m_chain.Tip();

    if (tip && tip->GetBlockHash() == coins_cache.GetBestBlock()) {
        return true;
    }

    // Load pointer to end of best chain
    CBlockIndex* pindex = m_blockman.LookupBlockIndex(coins_cache.GetBestBlock());
    if (!pindex) {
        return false;
    }
    m_chain.SetTip(*pindex);
    PruneBlockIndexCandidates();

    tip = m_chain.Tip();
    LogPrintf("Loaded best chain: hashBestChain=%s height=%d date=%s progress=%f\n",
              tip->GetBlockHash().ToString(),
              m_chain.Height(),
              FormatISO8601DateTime(tip->GetBlockTime()),
              GuessVerificationProgress(m_chainman.GetParams().TxData(), tip));
    return true;
}